

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::GetSynchControllersForObjects
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,IPalObject **rgObjects,
          DWORD dwObjectCount,void **ppvControllers,ControllerType ctCtrlrType)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ObjectDomain odObjectDomain;
  PAL_ERROR PVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 psdSynchData;
  CObjectType *potObjectType;
  WaitDomain WVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  CSynchWaitController *local_288;
  anon_union_512_2_150356a7 Ctrlrs;
  void *pvSData;
  CProcProcessLocalData *pProcLocData;
  IDataLock *pDataLock;
  void **local_68;
  uint local_5c;
  ulong local_58;
  WaitDomain local_4c;
  ulong local_48;
  CPalThread *local_40;
  ControllerType local_34;
  undefined4 extraout_var_01;
  
  if (dwObjectCount - 0x41 < 0xffffffc0) {
    PVar4 = 0x57;
  }
  else {
    local_68 = ppvControllers;
    local_34 = ctCtrlrType;
    if (ctCtrlrType == WaitController) {
      iVar1 = CSynchCache<CorUnix::CSynchWaitController>::Get
                        (&this->m_cacheWaitCtrlrs,pthrCurrent,dwObjectCount,&local_288);
      local_48 = CONCAT44(extraout_var_00,iVar1);
    }
    else {
      iVar1 = CSynchCache<CorUnix::CSynchStateController>::Get
                        (&this->m_cacheStateCtrlrs,pthrCurrent,dwObjectCount,
                         (CSynchStateController **)&local_288);
      local_48 = CONCAT44(extraout_var,iVar1);
    }
    local_58 = (ulong)dwObjectCount;
    local_5c = (uint)local_48;
    if ((uint)local_48 < dwObjectCount) {
      PVar4 = 8;
      uVar7 = 0;
LAB_00200c21:
      uVar6 = (uint)uVar7;
      if (local_34 == WaitController) {
LAB_00200c9c:
        uVar7 = (ulong)uVar6;
        for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          CSynchControllerBase::Release(&(&local_288)[uVar8]->super_CSynchControllerBase);
        }
        uVar8 = local_48 & 0xffffffff;
        for (; uVar7 < uVar8; uVar7 = uVar7 + 1) {
          CSynchCache<CorUnix::CSynchWaitController>::Add
                    (&this->m_cacheWaitCtrlrs,pthrCurrent,(&local_288)[uVar7]);
        }
      }
      else {
        uVar7 = uVar7 & 0xffffffff;
        for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          CSynchControllerBase::Release(&(&local_288)[uVar8]->super_CSynchControllerBase);
        }
        uVar8 = local_48 & 0xffffffff;
        for (; uVar7 < uVar8; uVar7 = uVar7 + 1) {
          CSynchCache<CorUnix::CSynchStateController>::Add
                    (&this->m_cacheStateCtrlrs,pthrCurrent,
                     (CSynchStateController *)(&local_288)[uVar7]);
        }
      }
      if (local_5c < (uint)local_58) {
        return PVar4;
      }
    }
    else {
      pDataLock = (IDataLock *)this;
      local_40 = pthrCurrent;
      AcquireLocalSynchLock(pthrCurrent);
      local_48 = (ulong)dwObjectCount;
      WVar5 = LocalWait;
      uVar7 = 0xffffffffffffffff;
      iVar1 = 0;
      do {
        iVar3 = iVar1;
        if (uVar7 - dwObjectCount == -1) goto LAB_00200ae2;
        iVar2 = (*rgObjects[uVar7 + 1]->_vptr_IPalObject[9])();
        iVar3 = (uint)(iVar2 == 1) + iVar1;
        iVar2 = (uint)(iVar2 == 1) + iVar1;
        uVar7 = uVar7 + 1;
        iVar1 = iVar3;
      } while (uVar7 <= iVar2 - 1);
      WVar5 = MixedWait;
LAB_00200ae2:
      local_4c = SharedWait;
      if (iVar3 != (uint)local_58) {
        local_4c = WVar5;
      }
      for (uVar7 = 0; local_48 != uVar7; uVar7 = uVar7 + 1) {
        odObjectDomain = (*rgObjects[uVar7]->_vptr_IPalObject[9])();
        PVar4 = (*rgObjects[uVar7]->_vptr_IPalObject[10])
                          (rgObjects[uVar7],Ctrlrs.pWaitCtrlrs + 0x3f);
        if (PVar4 != 0) {
          local_48 = local_58;
          this = (CPalSynchronizationManager *)pDataLock;
          pthrCurrent = local_40;
          goto LAB_00200c21;
        }
        psdSynchData = Ctrlrs.pWaitCtrlrs[0x3f];
        if (odObjectDomain == SharedObject) {
          psdSynchData = SHMPtrToPtr((SHMPTR)Ctrlrs.pWaitCtrlrs[0x3f]);
        }
        iVar1 = (**rgObjects[uVar7]->_vptr_IPalObject)();
        potObjectType = (CObjectType *)CONCAT44(extraout_var_01,iVar1);
        if (local_34 == WaitController) {
          CSynchControllerBase::Init
                    (&(&local_288)[uVar7]->super_CSynchControllerBase,local_40,WaitController,
                     odObjectDomain,potObjectType,(CSynchData *)psdSynchData,local_4c);
          pthrCurrent = local_40;
          this = (CPalSynchronizationManager *)pDataLock;
          if (potObjectType->m_eTypeId == otiProcess) {
            PVar4 = (*rgObjects[uVar7]->_vptr_IPalObject[3])
                              (rgObjects[uVar7],local_40,0,&pProcLocData,&pvSData);
            if (PVar4 != 0) {
              uVar6 = (int)uVar7 + 1;
              goto LAB_00200c9c;
            }
            CSynchWaitController::SetProcessLocalData
                      ((&local_288)[uVar7],(CProcProcessLocalData *)pvSData);
            (*(code *)**(undefined8 **)pProcLocData)(pProcLocData,pthrCurrent,0);
          }
        }
        else {
          CSynchControllerBase::Init
                    (&(&local_288)[uVar7]->super_CSynchControllerBase,local_40,local_34,
                     odObjectDomain,potObjectType,(CSynchData *)psdSynchData,local_4c);
        }
      }
      pthrCurrent = local_40;
      if (local_34 == WaitController) {
        PVar4 = 0;
        for (uVar7 = 0; local_48 != uVar7; uVar7 = uVar7 + 1) {
          local_68[uVar7] = (&local_288)[uVar7];
        }
      }
      else {
        PVar4 = 0;
        for (uVar7 = 0; local_48 != uVar7; uVar7 = uVar7 + 1) {
          local_68[uVar7] = (&local_288)[uVar7];
        }
      }
    }
    ReleaseLocalSynchLock(pthrCurrent);
  }
  return PVar4;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::GetSynchControllersForObjects(
        CPalThread *pthrCurrent,
        IPalObject *rgObjects[],
        DWORD dwObjectCount,
        void ** ppvControllers,
        CSynchControllerBase::ControllerType ctCtrlrType)
    {
        PAL_ERROR palErr = NO_ERROR;
        unsigned int uIdx, uCount = 0, uSharedObjectCount = 0;
        WaitDomain wdWaitDomain = LocalWait;
        CObjectType * potObjectType = NULL;
        unsigned int uErrCleanupIdxFirstNotInitializedCtrlr = 0;
        unsigned int uErrCleanupIdxLastCtrlr = 0;
        bool fLocalSynchLock = false;
        union
        {
            CSynchWaitController * pWaitCtrlrs[MAXIMUM_WAIT_OBJECTS];
            CSynchStateController * pStateCtrlrs[MAXIMUM_WAIT_OBJECTS];
        } Ctrlrs;

        if ((dwObjectCount <= 0) || (dwObjectCount > MAXIMUM_WAIT_OBJECTS))
        {
            palErr = ERROR_INVALID_PARAMETER;
            goto GSCFO_exit;
        }

        if (CSynchControllerBase::WaitController == ctCtrlrType)
        {
            uCount = (unsigned int)m_cacheWaitCtrlrs.Get(pthrCurrent,
                                                         dwObjectCount,
                                                         Ctrlrs.pWaitCtrlrs);
        }
        else
        {
            uCount = (unsigned int)m_cacheStateCtrlrs.Get(pthrCurrent,
                                                          dwObjectCount,
                                                          Ctrlrs.pStateCtrlrs);
        }
        if (uCount < dwObjectCount)
        {
            // We got less controllers (uCount) than we asked for (dwObjectCount),
            // probably because of low memory.
            // None of these controllers is initialized, so they must be all
            // returned directly to the cache
            uErrCleanupIdxLastCtrlr = uCount;

            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto GSCFO_error_cleanup;
        }

        //
        // We need to acquire the local synch lock before evaluating object
        // domains
        //
        AcquireLocalSynchLock(pthrCurrent);
        fLocalSynchLock = true;

        for (uIdx=0; uIdx<dwObjectCount; uIdx++)
        {
            if (SharedObject == rgObjects[uIdx]->GetObjectDomain())
            {
                ++uSharedObjectCount;
            }
            if (uSharedObjectCount > 0 && uSharedObjectCount <= uIdx)
            {
                wdWaitDomain = MixedWait;
                break;
            }
        }
        if (dwObjectCount == uSharedObjectCount)
        {
            wdWaitDomain = SharedWait;
        }

        for (uIdx=0;uIdx<dwObjectCount;uIdx++)
        {
            void * pvSData;
            CSynchData * psdSynchData;
            ObjectDomain odObjectDomain = rgObjects[uIdx]->GetObjectDomain();

            palErr = rgObjects[uIdx]->GetObjectSynchData((void **)&pvSData);
            if (NO_ERROR != palErr)
            {
                break;
            }

            psdSynchData = (SharedObject == odObjectDomain) ? SharedIDToTypePointer(
                CSynchData, reinterpret_cast<SharedID>(pvSData)) :
                static_cast<CSynchData *>(pvSData);

            VALIDATEOBJECT(psdSynchData);

            potObjectType = rgObjects[uIdx]->GetObjectType();


            if (CSynchControllerBase::WaitController == ctCtrlrType)
            {
                Ctrlrs.pWaitCtrlrs[uIdx]->Init(pthrCurrent,
                                            ctCtrlrType,
                                            odObjectDomain,
                                            potObjectType,
                                            psdSynchData,
                                            wdWaitDomain);
            }
            else
            {
                Ctrlrs.pStateCtrlrs[uIdx]->Init(pthrCurrent,
                                             ctCtrlrType,
                                             odObjectDomain,
                                             potObjectType,
                                             psdSynchData,
                                             wdWaitDomain);
            }

            if (CSynchControllerBase::WaitController == ctCtrlrType &&
                otiProcess == potObjectType->GetId())
            {
                CProcProcessLocalData * pProcLocData;
                IDataLock * pDataLock;

                palErr = rgObjects[uIdx]->GetProcessLocalData(
                    pthrCurrent,
                    ReadLock,
                    &pDataLock,
                    (void **)&pProcLocData);
                if (NO_ERROR != palErr)
                {
                    // In case of failure here, bail out of the loop, but
                    // keep track (by incrementing the counter 'uIdx') of the
                    // fact that this controller has already being initialized
                    // and therefore need to be Release'd rather than just
                    // returned to the cache
                    uIdx++;
                    break;
                }

                Ctrlrs.pWaitCtrlrs[uIdx]->SetProcessLocalData(pProcLocData);
                pDataLock->ReleaseLock(pthrCurrent, false);
            }
        }
        if (NO_ERROR != palErr)
        {
            // An error occurred while initializing the (uIdx+1)-th controller,
            // i.e. the one at index uIdx; therefore the first uIdx controllers
            // must be Release'd, while the remaining uCount-uIdx must be returned
            // directly to the cache.
            uErrCleanupIdxFirstNotInitializedCtrlr = uIdx;
            uErrCleanupIdxLastCtrlr = dwObjectCount;

            goto GSCFO_error_cleanup;
        }

        // Succeeded
        if (CSynchControllerBase::WaitController == ctCtrlrType)
        {
            for (uIdx=0;uIdx<dwObjectCount;uIdx++)
            {
                // The multiple cast is NEEDED, though currently it does not
                // change the value ot the pointer. Anyway, if in the future
                // a virtual method should be added to the base class
                // CSynchControllerBase, both derived classes would have two
                // virtual tables, therefore a static cast from, for instance,
                // a CSynchWaitController* to a ISynchWaitController* would
                // return the given pointer incremented by the size of a
                // generic pointer on the specific platform

                ppvControllers[uIdx] = reinterpret_cast<void *>(
                    static_cast<ISynchWaitController *>(Ctrlrs.pWaitCtrlrs[uIdx]));
            }
        }
        else
        {
            for (uIdx=0;uIdx<dwObjectCount;uIdx++)
            {
                // See comment above

                ppvControllers[uIdx] = reinterpret_cast<void *>(
                    static_cast<ISynchStateController *>(Ctrlrs.pStateCtrlrs[uIdx]));
            }
        }

        // Succeeded: skip error cleanup
        goto GSCFO_exit;

    GSCFO_error_cleanup:
        if (CSynchControllerBase::WaitController == ctCtrlrType)
        {
            // Release already initialized wait controllers
            for (uIdx=0; uIdx<uErrCleanupIdxFirstNotInitializedCtrlr; uIdx++)
            {
                Ctrlrs.pWaitCtrlrs[uIdx]->Release();
            }
            // Return to the cache not yet initialized wait controllers
            for (uIdx=uErrCleanupIdxFirstNotInitializedCtrlr; uIdx<uErrCleanupIdxLastCtrlr; uIdx++)
            {
                m_cacheWaitCtrlrs.Add(pthrCurrent, Ctrlrs.pWaitCtrlrs[uIdx]);
            }
        }
        else
        {
            // Release already initialized state controllers
            for (uIdx=0; uIdx<uErrCleanupIdxFirstNotInitializedCtrlr; uIdx++)
            {
                Ctrlrs.pStateCtrlrs[uIdx]->Release();
            }
            // Return to the cache not yet initialized state controllers
            for (uIdx=uErrCleanupIdxFirstNotInitializedCtrlr; uIdx<uErrCleanupIdxLastCtrlr; uIdx++)
            {
                m_cacheStateCtrlrs.Add(pthrCurrent, Ctrlrs.pStateCtrlrs[uIdx]);
            }
        }

    GSCFO_exit:

        if (fLocalSynchLock)
        {
            ReleaseLocalSynchLock(pthrCurrent);
        }
        return palErr;
    }